

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O0

bool __thiscall
matchit::impl::Id<mathiu::impl::Difference>::matchValue<mathiu::impl::Difference_const&>
          (Id<mathiu::impl::Difference> *this,Difference *v)

{
  bool bVar1;
  Difference *lhs;
  IdBlockBase<mathiu::impl::Difference> *this_00;
  ValueVariant<mathiu::impl::Difference> *pVVar2;
  Difference *v_local;
  Id<mathiu::impl::Difference> *this_local;
  
  bVar1 = hasValue(this);
  if (bVar1) {
    lhs = internalValue(this);
    this_local._7_1_ = IdTraits<mathiu::impl::Difference>::equal(lhs,v);
  }
  else {
    this_00 = &block(this)->super_IdBlockBase<mathiu::impl::Difference>;
    pVVar2 = IdBlockBase<mathiu::impl::Difference>::variant(this_00);
    IdUtil<mathiu::impl::Difference>::bindValue<mathiu::impl::Difference_const&>(pVVar2,v);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

constexpr auto
                matchValue(Value &&v) const
            {
                if (hasValue())
                {
                    return IdTraits<std::decay_t<Type>>::equal(internalValue(), v);
                }
                IdUtil<Type>::bindValue(block().variant(), std::forward<Value>(v),
                                   StorePointer<Type, Value>{});
                return true;
            }